

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void check_full_flip(void)

{
  roaring_bitmap_t *x1;
  roaring_bitmap_t *r;
  uint64_t uVar1;
  
  x1 = roaring_bitmap_create();
  r = roaring_bitmap_flip(x1,0,0x100000000);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 0x100000000),"roaring_bitmap_get_cardinality(r1) == bignumber",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x2b4);
  roaring_bitmap_free(r);
  roaring_bitmap_free(x1);
  return;
}

Assistant:

DEFINE_TEST(check_full_flip) {
    roaring_bitmap_t *rorg = roaring_bitmap_create();
    uint64_t bignumber = UINT64_C(0x100000000);
    roaring_bitmap_t *r1 = roaring_bitmap_flip(rorg, 0, bignumber);
    assert_true(roaring_bitmap_get_cardinality(r1) == bignumber);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(rorg);
}